

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O0

float soul::getBelaLoadFromString(string *input)

{
  bool bVar1;
  size_type sVar2;
  reference __str;
  undefined1 in_R8B;
  double dVar3;
  undefined1 auVar4 [16];
  string_view sVar5;
  string_view text;
  anon_class_1_0_00000001_for__M_pred local_c1;
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  string_view local_88;
  string_view local_78;
  reference local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *input_local;
  
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)input;
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
  sVar5._M_len = auVar4._8_8_;
  sVar5._M_str = (char *)0x1;
  choc::text::splitIntoLines_abi_cxx11_(&local_38,auVar4._0_8_,sVar5,(bool)in_R8B);
  local_20 = &local_38;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_20);
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_20);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_58);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_78 = sVar5;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"bela-audio")
    ;
    bVar1 = choc::text::contains(local_78,local_88);
    if (bVar1) {
      auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
      text._M_len = auVar4._8_8_;
      text._M_str = (char *)0x0;
      local_c0 = auVar4;
      choc::text::splitAtWhitespace_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,auVar4._0_8_,text,(bool)in_R8B);
      removeIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,soul::getBelaLoadFromString(std::__cxx11::string_const&)::__0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,&local_c1);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0);
      if (7 < sVar2) {
        __str = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_b0,7);
        dVar3 = std::__cxx11::stod(__str,(size_t *)0x0);
        input_local._4_4_ = (float)(dVar3 / 100.0);
      }
      l._4_4_ = (uint)(7 < sVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b0);
      if (l._4_4_ != 0) goto LAB_003211ce;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  l._4_4_ = 2;
LAB_003211ce:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  if (l._4_4_ != 1) {
    input_local._4_4_ = 0.0;
  }
  return input_local._4_4_;
}

Assistant:

float getBelaLoadFromString (const std::string& input)
{
    for (auto& l : choc::text::splitIntoLines (input, true))
    {
        if (choc::text::contains (l, "bela-audio"))
        {
            auto toks = choc::text::splitAtWhitespace (l);
            removeIf (toks, [] (const std::string& s) { return choc::text::trim (s).empty(); });

            if (toks.size() > 7)
                return (float) (std::stod (toks[7]) / 100.0f);
        }
    }

    return 0;
}